

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O0

void load_persons(storage_t *st)

{
  person_t p;
  int n;
  int i;
  person_t *in_stack_fffffffffffff1e0;
  person_t *in_stack_fffffffffffff268;
  storage_t *in_stack_fffffffffffff270;
  undefined4 local_c;
  
  for (local_c = 0; local_c < 100; local_c = local_c + 1) {
    gen_person(in_stack_fffffffffffff1e0);
    e2e_fdb_set_person(in_stack_fffffffffffff270,in_stack_fffffffffffff268);
  }
  return;
}

Assistant:

void load_persons(storage_t *st) {
    int i, n=100;
    person_t p;

    // store and index person docs
    for (i = 0; i < n; ++i) {
        gen_person(&p);
        e2e_fdb_set_person(st, &p);
    }

#ifdef __DEBUG_E2E
    printf("[%s] load persons: %03d docs created\n",st->keyspace, n);
#endif
}